

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O2

void RotationComp(sector_t_conflict *sec,int which,double dx,double dy,double *tdx,double *tdy)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = sec->planes[which].xform.baseAngle.Degrees + sec->planes[which].xform.Angle.Degrees;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    dVar1 = fastcosdeg(dVar3);
    dVar3 = fastsindeg(dVar3);
    dVar2 = dy * dVar3;
    dy = dx * -dVar3 - dVar1 * dy;
    dx = dVar2 - dVar1 * dx;
  }
  *tdx = dx;
  *tdy = dy;
  return;
}

Assistant:

static void RotationComp(const sector_t *sec, int which, double dx, double dy, double &tdx, double &tdy)
{
	DAngle an = sec->GetAngle(which);
	if (an == 0)
	{
		tdx = dx;
		tdy = dy;
	}
	else
	{
		double ca = -an.Cos();
		double sa = -an.Sin();
		tdx = dx*ca - dy*sa;
		tdy = dy*ca + dx*sa;
	}
}